

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

size_t duckdb_zstd::BIT_initDStream(BIT_DStream_t *bitD,void *srcBuffer,size_t srcSize)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ulong in_RDX;
  size_t in_RSI;
  size_t *in_RDI;
  BYTE lastByte_1;
  BYTE lastByte;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_28;
  size_t local_8;
  
  if (in_RDX == 0) {
    memset(in_RDI,0,0x28);
    local_8 = 0xffffffffffffffb8;
  }
  else {
    in_RDI[3] = in_RSI;
    in_RDI[4] = in_RDI[3] + 8;
    local_8 = in_RDX;
    if (in_RDX < 8) {
      in_RDI[2] = in_RDI[3];
      *in_RDI = (ulong)*(byte *)in_RDI[3];
      switch(in_RDX) {
      case 7:
        *in_RDI = ((ulong)*(byte *)(in_RSI + 6) << 0x30) + *in_RDI;
      case 6:
        *in_RDI = ((ulong)*(byte *)(in_RSI + 5) << 0x28) + *in_RDI;
      case 5:
        *in_RDI = ((ulong)*(byte *)(in_RSI + 4) << 0x20) + *in_RDI;
      case 4:
        *in_RDI = (ulong)*(byte *)(in_RSI + 3) * 0x1000000 + *in_RDI;
      case 3:
        *in_RDI = (ulong)*(byte *)(in_RSI + 2) * 0x10000 + *in_RDI;
      case 2:
        *in_RDI = (ulong)*(byte *)(in_RSI + 1) * 0x100 + *in_RDI;
      default:
        cVar1 = *(char *)(in_RSI + (in_RDX - 1));
        if (cVar1 == '\0') {
          iVar3 = 0;
        }
        else {
          uVar2 = ZSTD_highbit32(0);
          iVar3 = 8 - uVar2;
        }
        *(int *)(in_RDI + 1) = iVar3;
        if (cVar1 == '\0') {
          local_8 = 0xffffffffffffffec;
        }
        else {
          *(int *)(in_RDI + 1) = (8 - (int)in_RDX) * 8 + (int)in_RDI[1];
        }
      }
    }
    else {
      in_RDI[2] = (in_RSI + in_RDX) - 8;
      sVar4 = MEM_readLEST((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *in_RDI = sVar4;
      cVar1 = *(char *)(in_RSI + (in_RDX - 1));
      if (cVar1 == '\0') {
        local_28 = 0;
      }
      else {
        uVar2 = ZSTD_highbit32(0);
        local_28 = 8 - uVar2;
      }
      *(int *)(in_RDI + 1) = local_28;
      if (cVar1 == '\0') {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  return local_8;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                ZSTD_FALLTHROUGH;

        case 6: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                ZSTD_FALLTHROUGH;

        case 5: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                ZSTD_FALLTHROUGH;

        case 4: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[3]) << 24;
                ZSTD_FALLTHROUGH;

        case 3: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[2]) << 16;
                ZSTD_FALLTHROUGH;

        case 2: bitD->bitContainer += (BitContainerType)(((const BYTE*)(srcBuffer))[1]) <<  8;
                ZSTD_FALLTHROUGH;

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}